

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

mp_limb_t mpn_rshift(mp_ptr rp,mp_srcptr up,mp_size_t n,uint cnt)

{
  ulong uVar1;
  byte bVar2;
  long lVar3;
  mp_limb_t mVar4;
  long lVar5;
  ulong uVar6;
  
  if (n < 1) {
    __assert_fail("n >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0x286,"mp_limb_t mpn_rshift(mp_ptr, mp_srcptr, mp_size_t, unsigned int)");
  }
  if (cnt != 0) {
    if (cnt < 0x40) {
      bVar2 = (byte)cnt;
      uVar1 = *up;
      mVar4 = uVar1 >> (bVar2 & 0x3f);
      if (n != 1) {
        lVar5 = 0;
        lVar3 = 0;
        do {
          uVar6 = up[lVar3 + 1] << (0x40 - bVar2 & 0x3f) | mVar4;
          mVar4 = up[lVar3 + 1] >> (bVar2 & 0x3f);
          rp[lVar3] = uVar6;
          lVar3 = lVar3 + 1;
          lVar5 = lVar5 + -8;
        } while (n + -1 != lVar3);
        rp = (mp_ptr)((long)rp - lVar5);
      }
      *rp = mVar4;
      return uVar1 << (0x40 - bVar2 & 0x3f);
    }
    __assert_fail("cnt < GMP_LIMB_BITS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0x288,"mp_limb_t mpn_rshift(mp_ptr, mp_srcptr, mp_size_t, unsigned int)");
  }
  __assert_fail("cnt >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                ,0x287,"mp_limb_t mpn_rshift(mp_ptr, mp_srcptr, mp_size_t, unsigned int)");
}

Assistant:

mp_limb_t
mpn_rshift (mp_ptr rp, mp_srcptr up, mp_size_t n, unsigned int cnt)
{
  mp_limb_t high_limb, low_limb;
  unsigned int tnc;
  mp_limb_t retval;

  assert (n >= 1);
  assert (cnt >= 1);
  assert (cnt < GMP_LIMB_BITS);

  tnc = GMP_LIMB_BITS - cnt;
  high_limb = *up++;
  retval = (high_limb << tnc);
  low_limb = high_limb >> cnt;

  while (--n != 0)
    {
      high_limb = *up++;
      *rp++ = low_limb | (high_limb << tnc);
      low_limb = high_limb >> cnt;
    }
  *rp = low_limb;

  return retval;
}